

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O1

int adl_getBank(ADL_MIDIPlayer *device,ADL_BankId *idp,int flags,ADL_Bank *bank)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  BasicBankMap<OPL3::Bank> *this;
  pair<unsigned_long,_OPL3::Bank> value;
  pair<BasicBankMap<OPL3::Bank>::iterator,_bool> local_13d8;
  value_type local_13b8;
  
  iVar4 = -1;
  if (bank != (ADL_Bank *)0x0 && (idp != (ADL_BankId *)0x0 && device != (ADL_MIDIPlayer *)0x0)) {
    bVar1 = idp->msb;
    bVar2 = idp->lsb;
    if (idp->percussive < 2 && -1 < (char)(bVar2 | bVar1)) {
      if (device->adl_midiPlayer == (void *)0x0) {
        __assert_fail("play",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                      ,0x10d,
                      "int adl_getBank(ADL_MIDIPlayer *, const ADL_BankId *, int, ADL_Bank *)");
      }
      uVar5 = (ulong)((uint)(idp->percussive != 0) << 0xf | (uint)bVar1 << 8) | (ulong)bVar2;
      this = (BasicBankMap<OPL3::Bank> *)(*(long *)((long)device->adl_midiPlayer + 0x198) + 0xa0);
      if ((flags & 1U) == 0) {
        local_13d8.first.index = ((ulong)bVar1 & 1) << 7 | (ulong)bVar2;
        local_13d8.first.buckets =
             (this->m_buckets).
             super_AdlMIDI_SPtr<BasicBankMap<OPL3::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPL3::Bank>::Slot_*>_>
             .m_p;
        local_13d8.first.slot = (Slot *)(local_13d8.first.buckets + local_13d8.first.index);
        do {
          local_13d8.first.slot = (local_13d8.first.slot)->next;
          if (local_13d8.first.slot == (Slot *)0x0) {
            local_13d8.first.index = 0x100;
            local_13d8.first.slot = (Slot *)0x0;
            break;
          }
        } while (((local_13d8.first.slot)->value).first != uVar5);
        if ((local_13d8.first.slot == (Slot *)0x0) && ((int)local_13d8.first.index == 0x100)) {
          return -1;
        }
      }
      else {
        memset(&local_13b8,0,5000);
        local_13b8.first = uVar5;
        memset(&local_13b8.second,0,0x1380);
        lVar3 = 0x21;
        do {
          *(undefined1 *)((long)local_13b8.second.ins[0].op + lVar3 + -8) = 2;
          lVar3 = lVar3 + 0x27;
        } while (lVar3 != 0x13a1);
        if ((~flags & 3U) == 0) {
          BasicBankMap<OPL3::Bank>::insert(&local_13d8,this,&local_13b8);
          if ((void *)local_13d8.first.index == (void *)0x100 &&
              ((this->m_buckets).
               super_AdlMIDI_SPtr<BasicBankMap<OPL3::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPL3::Bank>::Slot_*>_>
               .m_p == local_13d8.first.buckets && local_13d8.first.slot == (Slot *)0x0)) {
            return -1;
          }
        }
        else {
          BasicBankMap<OPL3::Bank>::insert(&local_13d8,this,&local_13b8);
        }
      }
      bank->pointer[0] = local_13d8.first.buckets;
      bank->pointer[1] = local_13d8.first.slot;
      bank->pointer[2] = (void *)local_13d8.first.index;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

ADLMIDI_EXPORT int adl_getBank(ADL_MIDIPlayer *device, const ADL_BankId *idp, int flags, ADL_Bank *bank)
{
    if(!device || !idp || !bank)
        return -1;

    ADL_BankId id = *idp;
    if(id.lsb > 127 || id.msb > 127 || id.percussive > 1)
        return -1;
    size_t idnumber = ((id.msb << 8) | id.lsb | (id.percussive ? size_t(Synth::PercussionTag) : 0));

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it;
    if(!(flags & ADLMIDI_Bank_Create))
    {
        it = map.find(idnumber);
        if(it == map.end())
            return -1;
    }
    else
    {
        std::pair<size_t, Synth::Bank> value;
        value.first = idnumber;
        memset(&value.second, 0, sizeof(value.second));
        for (unsigned i = 0; i < 128; ++i)
            value.second.ins[i].flags = OplInstMeta::Flag_NoSound;

        std::pair<Synth::BankMap::iterator, bool> ir;
        if((flags & ADLMIDI_Bank_CreateRt) == ADLMIDI_Bank_CreateRt)
        {
            ir = map.insert(value, Synth::BankMap::do_not_expand_t());
            if(ir.first == map.end())
                return -1;
        }
        else
            ir = map.insert(value);
        it = ir.first;
    }

    it.to_ptrs(bank->pointer);
    return 0;
}